

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O0

bool __thiscall BlockDevice::SafetyCheck(BlockDevice *this)

{
  bool bVar1;
  BlockDevice *this_local;
  
  bVar1 = HDD::SafetyCheck(&this->super_HDD);
  return bVar1;
}

Assistant:

bool BlockDevice::SafetyCheck()
{
#ifdef _WIN32
    // Safety check can be skipped with the force option
    if (opt.force)
        return true;

    std::vector<std::string> lVolumes = GetVolumeList();
    std::string sRemoveList;

    for (size_t i = 0; i < lVolumes.size(); ++i)
    {
        char szVolName[64] = "";

        std::string sVolume = lVolumes.at(i);
        std::string sRoot = sVolume + "\\";

        // Only accept drives with a known filesystem, as drive letters exist for removeable
        // media even if no disk is preset, or if the filesystem is unknown
        if (GetVolumeInformation(sRoot.c_str(), szVolName, sizeof(szVolName), nullptr, nullptr, nullptr, nullptr, 0))
        {
            if (!sRemoveList.empty())
                sRemoveList += ", ";

            if (szVolName[0])
                sRemoveList += sVolume + " [" + szVolName + "]";
            else
                sRemoveList += sVolume;
        }
    }

    if (!sRemoveList.empty())
        util::cout << "These volumes may be removed: " << sRemoveList << '\n';
#endif

    return HDD::SafetyCheck();
}